

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O0

int __thiscall OpenMD::OpenMDBitSet::nextOnBit(OpenMDBitSet *this,int fromIndex)

{
  const_reference cVar1;
  size_t sVar2;
  uint in_ESI;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  int local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_ESI < 0x80000000) {
    for (local_14 = in_ESI + 1; sVar2 = size((OpenMDBitSet *)0x1cfc15), local_14 < (int)sVar2;
        local_14 = local_14 + 1) {
      cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (unaff_retaddr,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                        );
      if (cVar1) {
        return local_14;
      }
    }
  }
  return -1;
}

Assistant:

int OpenMDBitSet::nextOnBit(int fromIndex) const {
    if (fromIndex <= -1) {
      // in case -1 or other negative number is passed to this function
      return -1;
    }

    ++fromIndex;
    while (fromIndex < static_cast<int>(size())) {
      if (bitset_[fromIndex]) { return fromIndex; }
      ++fromIndex;
    }

    return -1;
  }